

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scp_dev.cpp
# Opt level: O0

bool WriteSuperCardPro(string *path,shared_ptr<Disk> *disk)

{
  bool bVar1;
  int def_cyls;
  int def_heads;
  exception *this;
  element_type *peVar2;
  anon_class_16_2_079ce462 local_98;
  function<void_(const_CylHead_&)> local_88;
  undefined1 local_68 [8];
  shared_ptr<SCPDevDisk> scp_dev_disk;
  unique_ptr<SuperCardPro,_std::default_delete<SuperCardPro>_> supercardpro;
  string local_40;
  shared_ptr<Disk> *local_20;
  shared_ptr<Disk> *disk_local;
  string *path_local;
  
  local_20 = disk;
  disk_local = (shared_ptr<Disk> *)path;
  util::lowercase(&local_40,path);
  bVar1 = std::operator!=(&local_40,"scp:");
  std::__cxx11::string::~string((string *)&local_40);
  if (bVar1) {
    path_local._7_1_ = 0;
  }
  else {
    SuperCardPro::Open();
    bVar1 = std::unique_ptr::operator_cast_to_bool
                      ((unique_ptr *)
                       &scp_dev_disk.super___shared_ptr<SCPDevDisk,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount);
    if (!bVar1) {
      this = (exception *)__cxa_allocate_exception(0x10);
      util::exception::exception<char_const(&)[36]>
                (this,(char (*) [36])"failed to open SuperCard Pro device");
      __cxa_throw(this,&util::exception::typeinfo,util::exception::~exception);
    }
    std::make_shared<SCPDevDisk,std::unique_ptr<SuperCardPro,std::default_delete<SuperCardPro>>>
              ((unique_ptr<SuperCardPro,_std::default_delete<SuperCardPro>_> *)local_68);
    peVar2 = std::__shared_ptr_access<SCPDevDisk,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<SCPDevDisk,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                        )local_68);
    def_cyls = Disk::cyls((Disk *)peVar2);
    peVar2 = std::__shared_ptr_access<SCPDevDisk,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<SCPDevDisk,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                        )local_68);
    def_heads = Disk::heads((Disk *)peVar2);
    ValidateRange(&opt.range,0x80,2,1,def_cyls,def_heads);
    local_98.disk = local_20;
    local_98.scp_dev_disk = (shared_ptr<SCPDevDisk> *)local_68;
    std::function<void(CylHead_const&)>::
    function<WriteSuperCardPro(std::__cxx11::string_const&,std::shared_ptr<Disk>&)::__0,void>
              ((function<void(CylHead_const&)> *)&local_88,&local_98);
    Range::each(&opt.range,&local_88,false);
    std::function<void_(const_CylHead_&)>::~function(&local_88);
    path_local._7_1_ = 1;
    std::shared_ptr<SCPDevDisk>::~shared_ptr((shared_ptr<SCPDevDisk> *)local_68);
    std::unique_ptr<SuperCardPro,_std::default_delete<SuperCardPro>_>::~unique_ptr
              ((unique_ptr<SuperCardPro,_std::default_delete<SuperCardPro>_> *)
               &scp_dev_disk.super___shared_ptr<SCPDevDisk,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
    ;
  }
  return (bool)(path_local._7_1_ & 1);
}

Assistant:

bool WriteSuperCardPro(const std::string& path, std::shared_ptr<Disk>& disk)
{
    if (util::lowercase(path) != "scp:")
        return false;

    auto supercardpro = SuperCardPro::Open();
    if (!supercardpro)
        throw util::exception("failed to open SuperCard Pro device");

    auto scp_dev_disk = std::make_shared<SCPDevDisk>(std::move(supercardpro));
    ValidateRange(opt.range, MAX_TRACKS, MAX_SIDES, 1, scp_dev_disk->cyls(), scp_dev_disk->heads());

    opt.range.each([&](const CylHead& cylhead)
        {
            auto trackdata = disk->read(cylhead);
            Message(msgStatus, "Writing %s", CH(cylhead.cyl, cylhead.head));
            scp_dev_disk->write(std::move(trackdata));
        });

    return true;
}